

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::TcpConnection::sendInLoop(TcpConnection *this,void *data,size_t len)

{
  uint64_t *puVar1;
  Channel *pCVar2;
  EventLoop *this_00;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  SourceFile file;
  Logger local_1078;
  undefined1 local_a8 [12];
  Functor local_98;
  Functor local_78;
  ulong local_58;
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_unsigned_long)> *local_50;
  EventLoop *local_48;
  shared_ptr<sznet::net::TcpConnection> local_40;
  
  EventLoop::assertInLoopThread(this->m_loop);
  if (this->m_state == kDisconnected) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_a8,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_a8._0_8_;
    file.m_size = local_a8._8_4_;
    Logger::Logger(&local_1078,file,0x7a,WARN);
    LogStream::operator<<(&local_1078.m_impl.m_stream,"disconnected, give up writing");
    Logger::~Logger(&local_1078);
    return;
  }
  pCVar2 = (this->m_channel)._M_t.
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  bVar3 = true;
  if (((pCVar2->m_events & 8) == 0) &&
     ((this->m_outputBuffer).m_writerIndex == (this->m_outputBuffer).m_readerIndex)) {
    uVar5 = sockets::sz_socket_write(pCVar2->m_fd,data,len);
    if (-1 < (long)uVar5) {
      puVar1 = &(this->m_netStatInfo).m_sendBytes;
      *puVar1 = *puVar1 + uVar5;
      bVar7 = len < uVar5;
      len = len - uVar5;
      if (len == 0) {
        if ((this->m_writeCompleteCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
          return;
        }
        this_00 = this->m_loop;
        std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<sznet::net::TcpConnection,void>
                  ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                   (__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
        std::
        _Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>(std::shared_ptr<sznet::net::TcpConnection>)>
        ::_Bind<std::shared_ptr<sznet::net::TcpConnection>>
                  ((_Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>(std::shared_ptr<sznet::net::TcpConnection>)>
                    *)&local_1078,&this->m_writeCompleteCallback,&local_40);
        std::function<void()>::
        function<std::_Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>(std::shared_ptr<sznet::net::TcpConnection>)>,void>
                  ((function<void()> *)&local_98,
                   (_Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_(std::shared_ptr<sznet::net::TcpConnection>)>
                    *)&local_1078);
        EventLoop::queueInLoop(this_00,&local_98);
        std::_Function_base::~_Function_base(&local_98.super__Function_base);
        std::
        _Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_(std::shared_ptr<sznet::net::TcpConnection>)>
        ::~_Bind((_Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_(std::shared_ptr<sznet::net::TcpConnection>)>
                  *)&local_1078);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_40.
                    super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        return;
      }
      if (bVar7) {
        __assert_fail("remaining <= len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                      ,0x97,"void sznet::net::TcpConnection::sendInLoop(const void *, size_t)");
      }
      goto LAB_0012acb0;
    }
    iVar4 = sz_getlasterr();
    if (iVar4 != 4) {
      uVar5 = 0;
      bVar3 = sockets::sz_wouldblock();
      goto LAB_0012acb0;
    }
  }
  uVar5 = 0;
LAB_0012acb0:
  if ((bVar3 != false) && (len != 0)) {
    uVar6 = (this->m_outputBuffer).m_writerIndex - (this->m_outputBuffer).m_readerIndex;
    if ((uVar6 < this->m_highWaterMark) &&
       ((uVar6 = uVar6 + len, this->m_highWaterMark <= uVar6 &&
        ((this->m_highWaterMarkCallback).super__Function_base._M_manager != (_Manager_type)0x0)))) {
      local_48 = this->m_loop;
      local_50 = &this->m_highWaterMarkCallback;
      std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<sznet::net::TcpConnection,void>
                ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                 (__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_58 = uVar6;
      std::
      _Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&,unsigned_long)>(std::shared_ptr<sznet::net::TcpConnection>,unsigned_long)>
      ::_Bind<std::shared_ptr<sznet::net::TcpConnection>,unsigned_long>
                ((_Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&,unsigned_long)>(std::shared_ptr<sznet::net::TcpConnection>,unsigned_long)>
                  *)&local_1078,local_50,&local_40,&local_58);
      std::function<void()>::
      function<std::_Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&,unsigned_long)>(std::shared_ptr<sznet::net::TcpConnection>,unsigned_long)>,void>
                ((function<void()> *)&local_78,
                 (_Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_unsigned_long)>_(std::shared_ptr<sznet::net::TcpConnection>,_unsigned_long)>
                  *)&local_1078);
      EventLoop::queueInLoop(local_48,&local_78);
      std::_Function_base::~_Function_base(&local_78.super__Function_base);
      std::
      _Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_unsigned_long)>_(std::shared_ptr<sznet::net::TcpConnection>,_unsigned_long)>
      ::~_Bind((_Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_unsigned_long)>_(std::shared_ptr<sznet::net::TcpConnection>,_unsigned_long)>
                *)&local_1078);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    Buffer::append(&this->m_outputBuffer,(char *)((long)data + uVar5),len);
    pCVar2 = (this->m_channel)._M_t.
             super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
             _M_t.
             super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
             .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
    if ((pCVar2->m_events & 8) == 0) {
      Channel::enableWriting(pCVar2);
    }
  }
  return;
}

Assistant:

void TcpConnection::sendInLoop(const void* data, size_t len)
{
	m_loop->assertInLoopThread();
	// �ѷ�����
	sz_ssize_t nwrote = 0;
	// ʣ������
	size_t remaining = len;
	// ��������
	bool faultError = false;

	if (m_state == kDisconnected)
	{
		LOG_WARN << "disconnected, give up writing";
		return;
	}

	// û�����ÿ�д�¼� && ���ͻ�����û�����ݣ�����������������
	if (!m_channel->isWriting() && m_outputBuffer.readableBytes() == 0)
	{
		nwrote = sockets::sz_socket_write(m_channel->fd(), data, len);
		if (nwrote >= 0)
		{
			m_netStatInfo.m_sendBytes += nwrote;
			remaining = len - nwrote;
			if (remaining == 0 && m_writeCompleteCallback)
			{
				m_loop->queueInLoop(std::bind(m_writeCompleteCallback, shared_from_this()));
			}
		}
		// nwrote < 0
		else
		{
			nwrote = 0;
			if (sz_getlasterr() != sz_err_eintr && !sockets::sz_wouldblock())
			{
				faultError = true;
			}
		}
	}
	
	// ȫ��������/���˲���/û����ȥ/������
	assert(remaining <= len);
	if (!faultError && remaining > 0)
	{
		size_t oldLen = m_outputBuffer.readableBytes();
		// �������ݻ�����û�г�����ˮλ�ߣ����Ҵ�����������������ʧ�ܣ����뻺�����󳬹���ˮλ�ߺ����лص�
		if (oldLen + remaining >= m_highWaterMark && oldLen < m_highWaterMark && m_highWaterMarkCallback)
		{
			m_loop->queueInLoop(std::bind(m_highWaterMarkCallback, shared_from_this(), oldLen + remaining));
		}
		m_outputBuffer.append(static_cast<const char*>(data) + nwrote, remaining);
		// ע����д�¼�
		if (!m_channel->isWriting())
		{
			m_channel->enableWriting();
		}
	}
}